

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O2

void __thiscall TestMakeCmakeComment_Oneline::Run(TestMakeCmakeComment_Oneline *this)

{
  __type _Var1;
  runtime_error *this_00;
  string comment;
  string expectedComment;
  string contents;
  
  std::__cxx11::string::string
            ((string *)&contents,"A oneline comment",(allocator *)&expectedComment);
  std::__cxx11::string::string
            ((string *)&expectedComment,"# A oneline comment\n",(allocator *)&comment);
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  MakeCmakeComment(&comment,&contents);
  _Var1 = std::operator==(&comment,&expectedComment);
  if (_Var1) {
    std::__cxx11::string::~string((string *)&comment);
    std::__cxx11::string::~string((string *)&expectedComment);
    std::__cxx11::string::~string((string *)&contents);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: comment == expectedComment");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(MakeCmakeComment_Oneline) {
  const std::string contents("A oneline comment");
  const std::string expectedComment("# A oneline comment\n");

  std::string comment;
  MakeCmakeComment(comment, contents);
  ASSERT(comment == expectedComment);
}